

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sigmoid.cpp
# Opt level: O2

int test_sigmoid(Mat *a)

{
  int iVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  ParamDict pd;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_950;
  Option local_938;
  ParamDict local_910;
  
  ncnn::ParamDict::ParamDict(&local_910);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&local_950,0,(allocator_type *)&local_938);
  ncnn::Option::Option(&local_938);
  local_938.num_threads = 1;
  local_938.use_int8_inference = false;
  local_938.use_vulkan_compute = true;
  iVar1 = test_layer<ncnn::Sigmoid>
                    ("Sigmoid",&local_910,&local_950,&local_938,a,0.001,
                     (_func_void_Sigmoid_ptr *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"test_sigmoid failed a.dims=%d a=(%d %d %d)\n",(ulong)(uint)a->dims,
            (ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_950);
  ncnn::ParamDict::~ParamDict(&local_910);
  return iVar1;
}

Assistant:

static int test_sigmoid(const ncnn::Mat& a)
{
    ncnn::ParamDict pd;

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Sigmoid>("Sigmoid", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_sigmoid failed a.dims=%d a=(%d %d %d)\n", a.dims, a.w, a.h, a.c);
    }

    return ret;
}